

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_split(REF_SHARD ref_shard)

{
  REF_GRID pRVar1;
  REF_CELL ref_cell;
  REF_STATUS RVar2;
  uint uVar3;
  undefined8 uVar4;
  REF_CELL ref_cell_00;
  char *pcVar5;
  int iVar6;
  REF_CELL pRVar7;
  REF_BOOL marked;
  REF_INT new_cell;
  REF_INT qua_nodes [5];
  REF_INT hex_nodes [27];
  int local_12c;
  REF_INT local_128;
  REF_INT RStack_124;
  REF_INT RStack_120;
  REF_INT RStack_11c;
  REF_INT RStack_118;
  REF_INT RStack_114;
  REF_INT local_104;
  REF_SHARD local_100;
  REF_CELL local_f8;
  REF_CELL local_f0;
  REF_INT local_e8;
  REF_INT RStack_e4;
  REF_INT RStack_e0;
  REF_INT RStack_dc;
  undefined4 uStack_d8;
  REF_INT local_c8;
  REF_INT RStack_c4;
  REF_INT RStack_c0;
  REF_INT RStack_bc;
  REF_INT RStack_b8;
  REF_INT RStack_b4;
  REF_INT RStack_b0;
  REF_INT RStack_ac;
  REF_CELL local_50;
  REF_INT local_48 [2];
  REF_INT RStack_40;
  undefined4 uStack_3c;
  
  pRVar1 = ref_shard->grid;
  local_f0 = pRVar1->cell[0xb];
  local_f8 = pRVar1->cell[10];
  pRVar7 = pRVar1->cell[3];
  ref_cell_00 = pRVar1->cell[6];
  local_100 = ref_shard;
  local_50 = ref_cell_00;
  for (iVar6 = 0; ref_cell = local_f8, iVar6 < ref_cell_00->max; iVar6 = iVar6 + 1) {
    RVar2 = ref_cell_nodes(ref_cell_00,iVar6,&local_e8);
    if (RVar2 == 0) {
      uVar3 = ref_shard_marked(local_100,local_e8,RStack_e0,&local_12c);
      if (uVar3 != 0) {
        pcVar5 = "0-2";
        uVar4 = 0x11a;
        goto LAB_00194c3b;
      }
      if (local_12c != 0) {
        uVar3 = ref_cell_remove(ref_cell_00,iVar6);
        if (uVar3 != 0) {
          pcVar5 = "remove qua";
          uVar4 = 0x11c;
          goto LAB_00194c3b;
        }
        local_48[0] = local_e8;
        RStack_40 = RStack_e0;
        uStack_3c = uStack_d8;
        uVar3 = ref_cell_add(pRVar7,local_48,&local_104);
        if (uVar3 != 0) {
          pcVar5 = "add tri";
          uVar4 = 0x121;
          goto LAB_00194c3b;
        }
        local_48[0] = local_e8;
        RStack_40 = RStack_dc;
        uStack_3c = uStack_d8;
        uVar3 = ref_cell_add(pRVar7,local_48,&local_104);
        ref_cell_00 = local_50;
        if (uVar3 != 0) {
          pcVar5 = "add tri";
          uVar4 = 0x126;
          goto LAB_00194c3b;
        }
      }
      uVar3 = ref_shard_marked(local_100,RStack_e4,RStack_dc,&local_12c);
      if (uVar3 != 0) {
        pcVar5 = "1-3";
        uVar4 = 0x129;
        goto LAB_00194c3b;
      }
      if (local_12c != 0) {
        uVar3 = ref_cell_remove(ref_cell_00,iVar6);
        if (uVar3 != 0) {
          pcVar5 = "remove qua";
          uVar4 = 299;
LAB_00194c3b:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 uVar4,"ref_shard_split",(ulong)uVar3,pcVar5);
          return uVar3;
        }
        local_48[0] = local_e8;
        RStack_40 = RStack_dc;
        uStack_3c = uStack_d8;
        uVar3 = ref_cell_add(pRVar7,local_48,&local_104);
        if (uVar3 != 0) {
          pcVar5 = "add tri";
          uVar4 = 0x130;
          goto LAB_00194c3b;
        }
        local_48[0] = RStack_e4;
        RStack_40 = RStack_dc;
        uStack_3c = uStack_d8;
        uVar3 = ref_cell_add(pRVar7,local_48,&local_104);
        ref_cell_00 = local_50;
        if (uVar3 != 0) {
          pcVar5 = "add tri";
          uVar4 = 0x135;
          goto LAB_00194c3b;
        }
      }
    }
  }
  iVar6 = 0;
  pRVar7 = local_f0;
  do {
    if (pRVar7->max <= iVar6) {
      return 0;
    }
    RVar2 = ref_cell_nodes(pRVar7,iVar6,&local_c8);
    if (RVar2 == 0) {
      uVar3 = ref_shard_marked(local_100,RStack_c4,RStack_b8,&local_12c);
      if (uVar3 != 0) {
        pcVar5 = "1-4";
        uVar4 = 0x13b;
        goto LAB_00195025;
      }
      if (local_12c == 0) {
        uVar3 = ref_shard_marked(local_100,local_c8,RStack_b4,&local_12c);
        if (uVar3 != 0) {
          pcVar5 = "0-5";
          uVar4 = 0x14f;
          goto LAB_00195025;
        }
        if (local_12c == 0) {
          uVar3 = ref_shard_marked(local_100,RStack_c4,RStack_b0,&local_12c);
          if (uVar3 != 0) {
            pcVar5 = "1-6";
            uVar4 = 0x164;
            goto LAB_00195025;
          }
          if (local_12c == 0) {
            uVar3 = ref_shard_marked(local_100,RStack_c0,RStack_b4,&local_12c);
            if (uVar3 != 0) {
              pcVar5 = "2-5";
              uVar4 = 0x178;
              goto LAB_00195025;
            }
            if (local_12c == 0) {
              uVar3 = ref_shard_marked(local_100,local_c8,RStack_c0,&local_12c);
              if (uVar3 != 0) {
                pcVar5 = "0-2";
                uVar4 = 0x18d;
                goto LAB_00195025;
              }
              if (local_12c == 0) {
                uVar3 = ref_shard_marked(local_100,RStack_c4,RStack_bc,&local_12c);
                if (uVar3 != 0) {
                  pcVar5 = "1-3";
                  uVar4 = 0x1a2;
                  goto LAB_00195025;
                }
                if (local_12c != 0) {
                  uVar3 = ref_cell_remove(pRVar7,iVar6);
                  pRVar7 = local_f8;
                  if (uVar3 != 0) {
                    pcVar5 = "remove hex";
                    uVar4 = 0x1a4;
                    goto LAB_00195025;
                  }
                  local_128 = local_c8;
                  RStack_124 = RStack_c4;
                  RStack_120 = RStack_bc;
                  RStack_11c = RStack_b8;
                  RStack_118 = RStack_b4;
                  RStack_114 = RStack_ac;
                  uVar3 = ref_cell_add(local_f8,&local_128,&local_104);
                  if (uVar3 != 0) {
                    pcVar5 = "add hex pri 1";
                    uVar4 = 0x1ab;
                    goto LAB_00195025;
                  }
                  local_128 = RStack_c4;
                  RStack_124 = RStack_c0;
                  RStack_120 = RStack_bc;
                  RStack_11c = RStack_b4;
                  RStack_118 = RStack_b0;
                  RStack_114 = RStack_ac;
                  uVar3 = ref_cell_add(pRVar7,&local_128,&local_104);
                  pRVar7 = local_f0;
                  if (uVar3 != 0) {
                    pcVar5 = "add hex_pri 2";
                    uVar4 = 0x1b2;
                    goto LAB_00195025;
                  }
                }
              }
              else {
                uVar3 = ref_cell_remove(pRVar7,iVar6);
                pRVar7 = local_f8;
                if (uVar3 != 0) {
                  pcVar5 = "remove hex";
                  uVar4 = 399;
                  goto LAB_00195025;
                }
                local_128 = local_c8;
                RStack_124 = RStack_c4;
                RStack_120 = RStack_c0;
                RStack_11c = RStack_b8;
                RStack_118 = RStack_b4;
                RStack_114 = RStack_b0;
                uVar3 = ref_cell_add(local_f8,&local_128,&local_104);
                if (uVar3 != 0) {
                  pcVar5 = "add hex pri 1";
                  uVar4 = 0x196;
                  goto LAB_00195025;
                }
                local_128 = local_c8;
                RStack_124 = RStack_c0;
                RStack_120 = RStack_bc;
                RStack_11c = RStack_b8;
                RStack_118 = RStack_b0;
                RStack_114 = RStack_ac;
                uVar3 = ref_cell_add(pRVar7,&local_128,&local_104);
                pRVar7 = local_f0;
                if (uVar3 != 0) {
                  pcVar5 = "add hex_pri 2";
                  uVar4 = 0x19d;
                  goto LAB_00195025;
                }
              }
            }
            else {
              uVar3 = ref_cell_remove(pRVar7,iVar6);
              pRVar7 = local_f8;
              if (uVar3 != 0) {
                pcVar5 = "remove hex";
                uVar4 = 0x17a;
                goto LAB_00195025;
              }
              local_128 = RStack_c4;
              RStack_124 = RStack_b4;
              RStack_120 = RStack_c0;
              RStack_11c = local_c8;
              RStack_118 = RStack_b8;
              RStack_114 = RStack_bc;
              uVar3 = ref_cell_add(local_f8,&local_128,&local_104);
              if (uVar3 != 0) {
                pcVar5 = "add hex pri 1";
                uVar4 = 0x181;
                goto LAB_00195025;
              }
              local_128 = RStack_c0;
              RStack_11c = RStack_bc;
              RStack_118 = RStack_b8;
              RStack_124 = RStack_b4;
              RStack_120 = RStack_b0;
              RStack_114 = RStack_ac;
              uVar3 = ref_cell_add(pRVar7,&local_128,&local_104);
              pRVar7 = local_f0;
              if (uVar3 != 0) {
                pcVar5 = "add hex pri 2";
                uVar4 = 0x188;
                goto LAB_00195025;
              }
            }
          }
          else {
            uVar3 = ref_cell_remove(pRVar7,iVar6);
            if (uVar3 != 0) {
              pcVar5 = "remove hex";
              uVar4 = 0x166;
              goto LAB_00195025;
            }
            local_128 = RStack_c4;
            RStack_11c = local_c8;
            RStack_118 = RStack_b8;
            RStack_114 = RStack_ac;
            uVar3 = ref_cell_add(ref_cell,&local_128,&local_104);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x16d,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
              return uVar3;
            }
            local_128 = RStack_c4;
            RStack_124 = RStack_b0;
            RStack_120 = RStack_c0;
            RStack_11c = local_c8;
            RStack_118 = RStack_ac;
            RStack_114 = RStack_bc;
            uVar3 = ref_cell_add(ref_cell,&local_128,&local_104);
            if (uVar3 != 0) {
              pcVar5 = "add hex_pri 2";
              uVar4 = 0x174;
              goto LAB_00195025;
            }
          }
        }
        else {
          uVar3 = ref_cell_remove(pRVar7,iVar6);
          pRVar7 = local_f8;
          if (uVar3 != 0) {
            pcVar5 = "remove hex";
            uVar4 = 0x151;
            goto LAB_00195025;
          }
          local_50 = (REF_CELL)CONCAT44(local_50._4_4_,iVar6);
          local_128 = local_c8;
          RStack_124 = RStack_b4;
          RStack_120 = RStack_c4;
          RStack_11c = RStack_bc;
          RStack_118 = RStack_b0;
          RStack_114 = RStack_c0;
          uVar3 = ref_cell_add(local_f8,&local_128,&local_104);
          if (uVar3 != 0) {
            pcVar5 = "add hex pri 1";
            uVar4 = 0x158;
            goto LAB_00195025;
          }
          local_128 = RStack_b8;
          RStack_124 = RStack_b4;
          RStack_120 = local_c8;
          RStack_11c = RStack_ac;
          RStack_118 = RStack_b0;
          RStack_114 = RStack_bc;
          uVar3 = ref_cell_add(pRVar7,&local_128,&local_104);
          pRVar7 = local_f0;
          iVar6 = (int)local_50;
          if (uVar3 != 0) {
            pcVar5 = "add hex_pri 2";
            uVar4 = 0x15f;
            goto LAB_00195025;
          }
        }
      }
      else {
        uVar3 = ref_cell_remove(pRVar7,iVar6);
        pRVar7 = local_f8;
        if (uVar3 != 0) {
          pcVar5 = "remove hex";
          uVar4 = 0x13d;
LAB_00195025:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 uVar4,"ref_shard_split",(ulong)uVar3,pcVar5);
          return uVar3;
        }
        local_128 = RStack_c4;
        RStack_124 = local_c8;
        RStack_120 = RStack_b8;
        RStack_11c = RStack_c0;
        RStack_118 = RStack_bc;
        RStack_114 = RStack_ac;
        uVar3 = ref_cell_add(local_f8,&local_128,&local_104);
        if (uVar3 != 0) {
          pcVar5 = "add hex pri 1";
          uVar4 = 0x144;
          goto LAB_00195025;
        }
        local_128 = RStack_c4;
        RStack_124 = RStack_b8;
        RStack_120 = RStack_b4;
        RStack_11c = RStack_c0;
        RStack_118 = RStack_ac;
        RStack_114 = RStack_b0;
        uVar3 = ref_cell_add(pRVar7,&local_128,&local_104);
        pRVar7 = local_f0;
        if (uVar3 != 0) {
          pcVar5 = "add hex_pri 2";
          uVar4 = 0x14b;
          goto LAB_00195025;
        }
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_shard_split(REF_SHARD ref_shard) {
  REF_GRID ref_grid;
  REF_CELL hex, pri, tri, qua;
  REF_INT cell, hex_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[6], new_cell;
  REF_INT tri_nodes[4], qua_nodes[5];
  REF_BOOL marked;

  ref_grid = ref_shard_grid(ref_shard);
  hex = ref_grid_hex(ref_grid);
  pri = ref_grid_pri(ref_grid);
  tri = ref_grid_tri(ref_grid);
  qua = ref_grid_qua(ref_grid);

  each_ref_cell_valid_cell_with_nodes(qua, cell, qua_nodes) {
    RSS(ref_shard_marked(ref_shard, qua_nodes[0], qua_nodes[2], &marked),
        "0-2");
    if (marked) {
      RSS(ref_cell_remove(qua, cell), "remove qua");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[2];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
    }
    RSS(ref_shard_marked(ref_shard, qua_nodes[1], qua_nodes[3], &marked),
        "1-3");
    if (marked) {
      RSS(ref_cell_remove(qua, cell), "remove qua");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
      tri_nodes[0] = qua_nodes[1];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
    }
  }

  each_ref_cell_valid_cell_with_nodes(hex, cell, hex_nodes) {
    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[4], &marked),
        "1-4");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[0];
      pri_nodes[2] = hex_nodes[4];
      pri_nodes[3] = hex_nodes[2];
      pri_nodes[4] = hex_nodes[3];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[4];
      pri_nodes[2] = hex_nodes[5];
      pri_nodes[3] = hex_nodes[2];
      pri_nodes[4] = hex_nodes[7];
      pri_nodes[5] = hex_nodes[6];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[5], &marked),
        "0-5");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[1];
      pri_nodes[3] = hex_nodes[3];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[2];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[4];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[0];
      pri_nodes[3] = hex_nodes[7];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[6], &marked),
        "1-6");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[6];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[6];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[7];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
    RSS(ref_shard_marked(ref_shard, hex_nodes[2], hex_nodes[5], &marked),
        "2-5");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[2];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[6];
      pri_nodes[3] = hex_nodes[3];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[2], &marked),
        "0-2");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[1];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[5];
      pri_nodes[5] = hex_nodes[6];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[2];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[3], &marked),
        "1-3");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[1];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[5];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[2];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[5];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
  }

  return REF_SUCCESS;
}